

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_parser.hpp
# Opt level: O1

void __thiscall
jsoncons::cbor::
basic_cbor_parser<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<char>_>
::produce_begin_multi_dim
          (basic_cbor_parser<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<char>_>
           *this,item_event_visitor *visitor,semantic_tag tag,error_code *ec)

{
  size_t *psVar1;
  uchar *puVar2;
  uchar *puVar3;
  assertion_error *this_00;
  ulong uVar4;
  uchar *puVar5;
  ulong uVar6;
  uint8_t b;
  uchar local_4d [5];
  string local_48;
  
  puVar2 = (this->source_).current_._M_current;
  puVar3 = (this->source_).end_._M_current;
  uVar4 = (ulong)(puVar3 != puVar2);
  if (puVar3 == puVar2) {
    psVar1 = &(this->source_).position_;
    *psVar1 = *psVar1 + uVar4;
  }
  else {
    puVar5 = puVar2 + 1;
    uVar6 = 0;
    do {
      (this->source_).current_._M_current = puVar5;
      local_4d[uVar6] = puVar5[-1];
      puVar5 = puVar5 + 1;
      uVar6 = uVar6 + 1;
    } while (uVar4 != uVar6);
    psVar1 = &(this->source_).position_;
    *psVar1 = *psVar1 + uVar4;
    if (puVar3 != puVar2) {
      uVar6 = CONCAT71((int7)((ulong)puVar2 >> 8),local_4d[0]) & 0xffffffe0;
      this_00 = (assertion_error *)
                __cxa_allocate_exception
                          (0x10,puVar5,uVar4,CONCAT71((int7)(uVar6 >> 8),-(char)uVar6));
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,
                 "assertion \'major_type == jsoncons::cbor::detail::cbor_major_type::array\' failed at  <> :0"
                 ,"");
      assertion_error::assertion_error(this_00,&local_48);
      __cxa_throw(this_00,&assertion_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  std::error_code::operator=(ec,unexpected_eof);
  this->more_ = false;
  return;
}

Assistant:

void produce_begin_multi_dim(item_event_visitor& visitor, 
                                 semantic_tag tag,
                                 std::error_code& ec)
    {
        uint8_t b;
        if (source_.read(&b, 1) == 0)
        {
            ec = cbor_errc::unexpected_eof;
            more_ = false;
            return;
        }
        jsoncons::cbor::detail::cbor_major_type major_type = get_major_type(b);
        JSONCONS_ASSERT(major_type == jsoncons::cbor::detail::cbor_major_type::array);
        uint8_t info = get_additional_information_value(b);
       
        read_shape(info, ec);   
        if (JSONCONS_UNLIKELY(ec))
        {
            return;
        }

        state_stack_.emplace_back(parse_mode::multi_dim, 0);
        visitor.begin_multi_dim(shape_, tag, *this, ec);
        more_ = !cursor_mode_;
    }